

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_list.cpp
# Opt level: O3

void __thiscall
duckdb::LogicalDependencyList::VerifyDependencies
          (LogicalDependencyList *this,Catalog *catalog,string *name)

{
  AttachedDatabase *pAVar1;
  _Hash_node_base *__n;
  pointer pcVar2;
  int iVar3;
  DependencyException *this_00;
  _Hash_node_base *p_Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p_Var4 = (this->set)._M_h._M_before_begin._M_nxt;
  if (p_Var4 != (_Hash_node_base *)0x0) {
    pAVar1 = catalog->db;
    __n = (_Hash_node_base *)(pAVar1->super_CatalogEntry).name._M_string_length;
    do {
      if (p_Var4[0xb]._M_nxt != __n) {
LAB_002672b4:
        this_00 = (DependencyException *)__cxa_allocate_exception(0x10);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,
                   "Error adding dependency for object \"%s\" - dependency \"%s\" is in catalog \"%s\", which does not match the catalog \"%s\".\nCross catalog dependencies are not supported."
                   ,"");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar2 = (name->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,pcVar2 + name->_M_string_length);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,p_Var4[6]._M_nxt,
                   (long)&(p_Var4[6]._M_nxt)->_M_nxt + (long)&(p_Var4[7]._M_nxt)->_M_nxt);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,p_Var4[10]._M_nxt,
                   (long)&(p_Var4[10]._M_nxt)->_M_nxt + (long)&(p_Var4[0xb]._M_nxt)->_M_nxt);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        pcVar2 = (catalog->db->super_CatalogEntry).name._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,pcVar2,
                   pcVar2 + (catalog->db->super_CatalogEntry).name._M_string_length);
        DependencyException::
        DependencyException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (this_00,&local_90,&local_50,&local_70,&local_b0,&local_d0);
        __cxa_throw(this_00,&DependencyException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (__n != (_Hash_node_base *)0x0) {
        iVar3 = bcmp(p_Var4[10]._M_nxt,(pAVar1->super_CatalogEntry).name._M_dataplus._M_p,
                     (size_t)__n);
        if (iVar3 != 0) goto LAB_002672b4;
      }
      p_Var4 = p_Var4->_M_nxt;
    } while (p_Var4 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void LogicalDependencyList::VerifyDependencies(Catalog &catalog, const string &name) {
	for (auto &dep : set) {
		if (dep.catalog != catalog.GetName()) {
			throw DependencyException(
			    "Error adding dependency for object \"%s\" - dependency \"%s\" is in catalog "
			    "\"%s\", which does not match the catalog \"%s\".\nCross catalog dependencies are not supported.",
			    name, dep.entry.name, dep.catalog, catalog.GetName());
		}
	}
}